

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_bench.cxx
# Opt level: O0

int raft_bench::worker_func(ThreadArgs *_args)

{
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l;
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  element_type *this;
  ostream *poVar4;
  size_t sVar5;
  void *pvVar6;
  long in_RDI;
  lock_guard<std::mutex> l_1;
  ptr<raft_result> ret;
  Timer timer;
  lock_guard<std::mutex> l;
  size_t num_ops;
  ptr<buffer> msg;
  worker_params *args;
  string *in_stack_fffffffffffffba8;
  Timer *in_stack_fffffffffffffbb0;
  ostream *in_stack_fffffffffffffbb8;
  ostream *in_stack_fffffffffffffbc0;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
  *in_stack_fffffffffffffbc8;
  Timer *in_stack_fffffffffffffbd0;
  ostream *in_stack_fffffffffffffbd8;
  ostream *in_stack_fffffffffffffbe0;
  WorkloadGenerator *in_stack_fffffffffffffbe8;
  ostream *in_stack_fffffffffffffbf0;
  ostream *in_stack_fffffffffffffc10;
  raft_server *in_stack_fffffffffffffc18;
  ostream *in_stack_fffffffffffffcd0;
  __shared_ptr *in_stack_fffffffffffffcd8;
  LatencyCollector *in_stack_fffffffffffffce0;
  size_t in_stack_fffffffffffffcf8;
  undefined8 **local_1c0;
  string local_170 [36];
  int local_14c;
  native_handle_type local_148;
  char local_13d;
  int local_13c;
  string local_138 [39];
  allocator local_111;
  string local_110 [40];
  undefined8 *local_e8 [2];
  undefined1 **local_d8;
  undefined8 local_d0;
  string local_90 [40];
  size_t local_68;
  long local_40;
  int local_2c;
  long local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  string *local_8;
  
  local_40 = in_RDI;
  nuraft::buffer::alloc(in_stack_fffffffffffffcf8);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x17e060);
  nuraft::buffer::put((buffer *)in_stack_fffffffffffffbe0,
                      (byte)((ulong)in_stack_fffffffffffffbd8 >> 0x38));
  do {
    while( true ) {
      bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffbb8);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_2c = 0;
        local_14c = 1;
        goto LAB_0017efc4;
      }
      local_68 = 0;
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_fffffffffffffbb0,
                 (mutex_type *)in_stack_fffffffffffffba8);
      local_68 = TestSuite::WorkloadGenerator::getNumOpsToDo(in_stack_fffffffffffffbe8);
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x17e0e9);
      if (local_68 != 0) break;
      std::__cxx11::string::string(local_90);
      TestSuite::sleep_ms((size_t)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::__cxx11::string::~string(local_90);
    }
    TestSuite::Timer::Timer(in_stack_fffffffffffffbb0);
    std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x17e1b4);
    nuraft::buffer::pos((buffer *)in_stack_fffffffffffffbd0,(size_t)in_stack_fffffffffffffbc8);
    std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x17e1da);
    std::shared_ptr<nuraft::buffer>::shared_ptr
              ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffbb0,
               (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffba8);
    local_d0 = 1;
    local_d8 = (undefined1 **)local_e8;
    std::allocator<std::shared_ptr<nuraft::buffer>_>::allocator
              ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x17e230);
    __l._M_len = (size_type)in_stack_fffffffffffffbf0;
    __l._M_array = (iterator)in_stack_fffffffffffffbe8;
    std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
              *)in_stack_fffffffffffffbe0,__l,(allocator_type *)in_stack_fffffffffffffbd8);
    nuraft::raft_server::append_entries
              (in_stack_fffffffffffffc18,
               (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                *)in_stack_fffffffffffffc10);
    std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
    ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
               *)in_stack_fffffffffffffbc0);
    std::allocator<std::shared_ptr<nuraft::buffer>_>::~allocator
              ((allocator<std::shared_ptr<nuraft::buffer>_> *)0x17e290);
    local_1c0 = &local_d8;
    do {
      local_1c0 = local_1c0 + -2;
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x17e2c5);
    } while (local_1c0 != local_e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"rep",&local_111);
    TestSuite::Timer::getTimeUs(in_stack_fffffffffffffbd0);
    LatencyCollector::addLatency
              (in_stack_fffffffffffffce0,(string *)in_stack_fffffffffffffcd8,
               (uint64_t)in_stack_fffffffffffffcd0);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    this = std::
           __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x17e371);
    bVar1 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
            get_accepted(this);
    if (bVar1) {
      std::
      __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x17e974);
      in_stack_fffffffffffffcd8 =
           (__shared_ptr *)
           nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
           get(in_stack_fffffffffffffbc8);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(in_stack_fffffffffffffcd8);
      if (bVar1) {
        std::lock_guard<std::mutex>::lock_guard
                  ((lock_guard<std::mutex> *)in_stack_fffffffffffffbb0,
                   (mutex_type *)in_stack_fffffffffffffba8);
        TestSuite::WorkloadGenerator::addNumOpsDone((WorkloadGenerator *)(local_40 + 0x20),1);
        std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x17ee5e);
        in_stack_fffffffffffffba8 = (string *)(local_40 + 0x18);
        local_10 = 1;
        local_14 = 5;
        local_20 = 1;
        in_stack_fffffffffffffbb0 = (Timer *)0x4;
        LOCK();
        local_28 = *(long *)in_stack_fffffffffffffba8;
        *(long *)in_stack_fffffffffffffba8 = *(long *)in_stack_fffffffffffffba8 + 1;
        UNLOCK();
        local_14c = 0;
        local_8 = in_stack_fffffffffffffba8;
      }
      else {
        in_stack_fffffffffffffcd0 =
             (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(in_stack_fffffffffffffcd0,"        time: ");
        poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar4 = std::operator<<(poVar4,local_170);
        poVar4 = std::operator<<(poVar4,"\x1b[0m");
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"      thread: ");
        poVar4 = std::operator<<(poVar4,"\x1b[33m");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
        _Var3 = std::setw(4);
        poVar4 = std::operator<<(poVar4,_Var3);
        _Var2 = std::setfill<char>('0');
        poVar4 = std::operator<<(poVar4,_Var2._M_c);
        std::this_thread::get_id();
        sVar5 = std::hash<std::thread::id>::operator()
                          ((hash<std::thread::id> *)in_stack_fffffffffffffbb0,
                           (id *)in_stack_fffffffffffffba8);
        pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
        poVar4 = std::operator<<(poVar4,"\x1b[0m");
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"          in: ");
        poVar4 = std::operator<<(poVar4,"\x1b[36m");
        poVar4 = std::operator<<(poVar4,"worker_func");
        poVar4 = std::operator<<(poVar4,"()\x1b[0m");
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"          at: ");
        in_stack_fffffffffffffc18 = (raft_server *)std::operator<<(poVar4,"\x1b[32m");
        in_stack_fffffffffffffc10 =
             std::operator<<((ostream *)in_stack_fffffffffffffc18,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/bench/raft_bench.cxx"
                            );
        poVar4 = std::operator<<(in_stack_fffffffffffffc10,"\x1b[0m:");
        poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x134);
        in_stack_fffffffffffffbf0 = std::operator<<(poVar4,"\x1b[0m");
        in_stack_fffffffffffffbe8 =
             (WorkloadGenerator *)std::operator<<(in_stack_fffffffffffffbf0,"\n");
        in_stack_fffffffffffffbe0 =
             std::operator<<((ostream *)in_stack_fffffffffffffbe8,
                             "    value of: \x1b[1;34mret->get()\x1b[0m\n");
        in_stack_fffffffffffffbd8 =
             std::operator<<(in_stack_fffffffffffffbe0,"    expected: \x1b[1;32m");
        in_stack_fffffffffffffbd0 = (Timer *)std::operator<<(in_stack_fffffffffffffbd8,"non-NULL");
        in_stack_fffffffffffffbc8 =
             (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
             std::operator<<((ostream *)in_stack_fffffffffffffbd0,"\x1b[0m\n");
        in_stack_fffffffffffffbc0 =
             std::operator<<((ostream *)in_stack_fffffffffffffbc8,"      actual: \x1b[1;31m");
        in_stack_fffffffffffffbb8 = std::operator<<(in_stack_fffffffffffffbc0,"NULL");
        std::operator<<(in_stack_fffffffffffffbb8,"\x1b[0m\n");
        std::__cxx11::string::~string(local_170);
        TestSuite::failHandler();
        local_2c = -1;
        local_14c = 1;
      }
    }
    else {
      poVar4 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"        time: ");
      poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar4 = std::operator<<(poVar4,local_138);
      poVar4 = std::operator<<(poVar4,"\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"      thread: ");
      poVar4 = std::operator<<(poVar4,"\x1b[33m");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
      local_13c = (int)std::setw(4);
      poVar4 = std::operator<<(poVar4,(_Setw)local_13c);
      local_13d = (char)std::setfill<char>('0');
      poVar4 = std::operator<<(poVar4,local_13d);
      local_148 = (native_handle_type)std::this_thread::get_id();
      sVar5 = std::hash<std::thread::id>::operator()
                        ((hash<std::thread::id> *)in_stack_fffffffffffffbb0,
                         (id *)in_stack_fffffffffffffba8);
      pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
      poVar4 = (ostream *)std::ostream::operator<<(pvVar6,std::dec);
      poVar4 = std::operator<<(poVar4,"\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"          in: ");
      poVar4 = std::operator<<(poVar4,"\x1b[36m");
      poVar4 = std::operator<<(poVar4,"worker_func");
      poVar4 = std::operator<<(poVar4,"()\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"          at: ");
      poVar4 = std::operator<<(poVar4,"\x1b[32m");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/bench/raft_bench.cxx"
                              );
      poVar4 = std::operator<<(poVar4,"\x1b[0m:");
      poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x133);
      poVar4 = std::operator<<(poVar4,"\x1b[0m");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"    value of: \x1b[1;34mret->get_accepted()\x1b[0m\n");
      poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
      poVar4 = std::operator<<(poVar4,"true");
      poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
      poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
      poVar4 = std::operator<<(poVar4,"false");
      std::operator<<(poVar4,"\x1b[0m\n");
      std::__cxx11::string::~string(local_138);
      TestSuite::failHandler();
      local_2c = -1;
      local_14c = 1;
    }
    std::
    shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
    ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                   *)0x17ef6c);
  } while (local_14c == 0);
LAB_0017efc4:
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x17efd1);
  return local_2c;
}

Assistant:

int worker_func(TestSuite::ThreadArgs* _args) {
    worker_params* args = static_cast<worker_params*>(_args);

    ptr<buffer> msg = buffer::alloc(args->config_.payload_size_);
    msg->put( (byte)0x0 );

    while (!args->stop_signal_) {
        size_t num_ops = 0;
        {   std::lock_guard<std::mutex> l(args->wg_lock_);
            num_ops = args->wg_.getNumOpsToDo();
        }
        if (!num_ops) {
            TestSuite::sleep_ms(1);
            continue;
        }

        TestSuite::Timer timer;

        msg->pos(0);
        ptr<raft_result> ret =
            args->stuff_.raft_instance_->append_entries( {msg} );
        global_lat.addLatency("rep", timer.getTimeUs());

        CHK_TRUE( ret->get_accepted() );
        CHK_NONNULL( ret->get() );

        {   std::lock_guard<std::mutex> l(args->wg_lock_);
            args->wg_.addNumOpsDone(1);
        }
        args->num_ops_done_.fetch_add(1);
    }

    return 0;
}